

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O2

void __thiscall libDAI::JTree::JTree(JTree *this,FactorGraph *fg,Properties *opts,bool automatic)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  undefined4 extraout_var_01;
  value_type *__x;
  undefined4 extraout_var_02;
  ostream *poVar5;
  undefined4 extraout_var_03;
  ClusterGraph *pCVar6;
  undefined4 extraout_var_04;
  Exception *pEVar7;
  long lVar8;
  size_t i;
  size_t I;
  ulong uVar9;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> ElimVec;
  vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_> cl;
  BipartiteGraph<libDAI::Var,_libDAI::VarSet> local_260;
  ClusterGraph _cg;
  
  RegionGraph::RegionGraph((RegionGraph *)&_cg,fg);
  DAIAlg<libDAI::RegionGraph>::DAIAlg(&this->super_DAIAlgRG,(RegionGraph *)&_cg,opts);
  RegionGraph::~RegionGraph((RegionGraph *)&_cg);
  (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061ec58;
  *(undefined8 *)&this->Props = 0;
  (this->Props).verbose = 0;
  (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qa).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_Qb).super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mes).
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_logZ = 0.0;
  bVar1 = initProps(this);
  if (!bVar1) {
    pEVar7 = (Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&_cg,"jtree.cpp, line 52",(allocator<char> *)&local_260);
    Exception::Exception(pEVar7,8,(string *)&_cg);
    __cxa_throw(pEVar7,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar3));
  if (cVar2 != '\0') {
    if (automatic) {
      uVar9 = 0;
      cl.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cl.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      cl.super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      while( true ) {
        iVar3 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x48))
                          ((long *)CONCAT44(extraout_var_00,iVar3));
        if (uVar4 <= uVar9) break;
        iVar3 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        __x = (value_type *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x50))
                        ((long *)CONCAT44(extraout_var_01,iVar3),uVar9);
        std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::push_back(&cl,__x);
        uVar9 = uVar9 + 1;
      }
      ClusterGraph::ClusterGraph(&_cg,&cl);
      iVar3 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      if (2 < CONCAT44(extraout_var_02,iVar3)) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Initial clusters: ");
        poVar5 = libDAI::operator<<(poVar5,&_cg);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      ClusterGraph::eraseNonMaximal(&_cg);
      iVar3 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      if (2 < CONCAT44(extraout_var_03,iVar3)) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Maximal clusters: ");
        poVar5 = libDAI::operator<<(poVar5,&_cg);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      ClusterGraph::VarElim_MinFill((ClusterGraph *)&local_260,&_cg);
      pCVar6 = ClusterGraph::eraseNonMaximal((ClusterGraph *)&local_260);
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::vector
                (&ElimVec,&(pCVar6->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2);
      BipartiteGraph<libDAI::Var,_libDAI::VarSet>::~BipartiteGraph(&local_260);
      iVar3 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      if (2 < CONCAT44(extraout_var_04,iVar3)) {
        poVar5 = std::operator<<((ostream *)&std::cout,"VarElim_MinFill result: {");
        std::endl<char,std::char_traits<char>>(poVar5);
        lVar8 = 0;
        for (uVar9 = 0;
            uVar9 < (ulong)((long)ElimVec.
                                  super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)ElimVec.
                                  super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1
            ) {
          if (uVar9 != 0) {
            std::operator<<((ostream *)&std::cout,", ");
          }
          libDAI::operator<<((ostream *)&std::cout,
                             (VarSet *)
                             ((long)&((ElimVec.
                                       super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_vars).
                                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar8));
          lVar8 = lVar8 + 0x20;
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"}");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      GenerateJT(this,&ElimVec);
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&ElimVec);
      BipartiteGraph<libDAI::Var,_libDAI::VarSet>::~BipartiteGraph
                (&_cg.super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>);
      std::vector<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>::~vector(&cl);
    }
    return;
  }
  pEVar7 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&_cg,"jtree.cpp, line 55",(allocator<char> *)&local_260);
  Exception::Exception(pEVar7,10,(string *)&_cg);
  __cxa_throw(pEVar7,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JTree::JTree( const FactorGraph &fg, const Properties &opts, bool automatic ) : DAIAlgRG(fg, opts), Props(), _RTree(), _Qa(), _Qb(), _mes(), _logZ() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        if( !grm().isConnected() ) 
           DAI_THROW(FACTORGRAPH_NOT_CONNECTED); 

        if( automatic ) {
            // Create ClusterGraph which contains factors as clusters
            vector<VarSet> cl;
            for( size_t I = 0; I < grm().nrFactors(); I++ )
                cl.push_back( grm().factor(I).vars() );
            ClusterGraph _cg(cl);

            if( Verbose() >= 3 ) {
                cout << "Initial clusters: " << _cg << endl;
            }

            // Retain only maximal clusters
            _cg.eraseNonMaximal();
            if( Verbose() >= 3 )
                cout << "Maximal clusters: " << _cg << endl;

            vector<VarSet> ElimVec = _cg.VarElim_MinFill().eraseNonMaximal().toVector();
            if( Verbose() >= 3 ) {
                cout << "VarElim_MinFill result: {" << endl;
                for( size_t i = 0; i < ElimVec.size(); i++ ) {
                    if( i != 0 )
                        cout << ", ";
                    cout << ElimVec[i];
                }
                cout << "}" << endl;
            }

            GenerateJT( ElimVec );
        }
    }